

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O2

UINT8 __thiscall DROPlayer::LoadFile(DROPlayer *this,DATA_LOADER *dataLoader)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  UINT16 UVar1;
  long *plVar2;
  pointer puVar3;
  UINT8 UVar4;
  UINT32 UVar5;
  undefined8 in_RAX;
  UINT8 *pUVar6;
  byte bVar7;
  uint uVar8;
  uchar *__args;
  reference rVar9;
  undefined8 local_28;
  
  this->_dLoad = (DATA_LOADER *)0x0;
  local_28 = in_RAX;
  DataLoader_ReadUntil(dataLoader,0x10);
  pUVar6 = DataLoader_GetData(dataLoader);
  this->_fileData = pUVar6;
  UVar5 = DataLoader_GetSize(dataLoader);
  if (UVar5 < 0x10) {
    return 0xf0;
  }
  plVar2 = (long *)this->_fileData;
  if (*plVar2 != 0x4c504f5741524244) {
    return 0xf0;
  }
  uVar8 = *(uint *)(plVar2 + 1);
  if ((uVar8 & 0xff00ff00) == 0) {
    if ((char)uVar8 == '\0') {
      (this->_fileHdr).verMinor = (UINT16)uVar8;
      uVar8 = (uint)*(ushort *)((long)plVar2 + 10);
      (this->_fileHdr).verMajor = *(ushort *)((long)plVar2 + 10);
    }
    else {
      (this->_fileHdr).verMajor = (UINT16)uVar8;
      (this->_fileHdr).verMinor = *(UINT16 *)((long)plVar2 + 10);
    }
    if (2 < (ushort)uVar8) {
      return 0xf1;
    }
  }
  else {
    (this->_fileHdr).verMajor = 0;
    (this->_fileHdr).verMinor = 0;
  }
  this->_dLoad = dataLoader;
  DataLoader_ReadAll(dataLoader);
  pUVar6 = DataLoader_GetData(this->_dLoad);
  this->_fileData = pUVar6;
  UVar1 = (this->_fileHdr).verMajor;
  if (UVar1 == 2) {
    (this->_fileHdr).dataSize = *(int *)(pUVar6 + 0xc) * 2;
    (this->_fileHdr).lengthMS = *(UINT32 *)(pUVar6 + 0x10);
    (this->_fileHdr).hwType = pUVar6[0x14];
    (this->_fileHdr).format = pUVar6[0x15];
    (this->_fileHdr).compression = pUVar6[0x16];
    (this->_fileHdr).cmdDlyShort = pUVar6[0x17];
    (this->_fileHdr).cmdDlyLong = pUVar6[0x18];
    bVar7 = pUVar6[0x19];
    (this->_fileHdr).regCmdCnt = bVar7;
    (this->_fileHdr).dataOfs = bVar7 + 0x1a;
    if (0x80 < bVar7) {
      (this->_fileHdr).regCmdCnt = 0x80;
      bVar7 = 0x80;
    }
    memcpy((this->_fileHdr).regCmdMap,pUVar6 + 0x1a,(ulong)bVar7);
  }
  else {
    if (UVar1 == 1) {
      (this->_fileHdr).lengthMS = *(UINT32 *)(pUVar6 + 0xc);
      (this->_fileHdr).dataSize = *(UINT32 *)(pUVar6 + 0x10);
      uVar8 = 0xff;
      if (*(uint *)(pUVar6 + 0x14) < 0xff) {
        uVar8 = *(uint *)(pUVar6 + 0x14);
      }
      UVar5 = 0x18;
    }
    else {
      if (UVar1 != 0) goto LAB_001116e0;
      (this->_fileHdr).lengthMS = *(UINT32 *)(pUVar6 + 8);
      (this->_fileHdr).dataSize = *(UINT32 *)(pUVar6 + 0xc);
      uVar8 = (uint)pUVar6[0x10];
      UVar5 = 0x11;
    }
    (this->_fileHdr).hwType = (UINT8)uVar8;
    (this->_fileHdr).dataOfs = UVar5;
    if ((UINT8)uVar8 == '\x01') {
      UVar4 = '\x02';
LAB_001116d2:
      (this->_fileHdr).hwType = UVar4;
    }
    else if ((uVar8 & 0xff) == 2) {
      UVar4 = '\x01';
      goto LAB_001116d2;
    }
    (this->_fileHdr).format = '\0';
    (this->_fileHdr).compression = '\0';
    (this->_fileHdr).cmdDlyShort = '\0';
    (this->_fileHdr).cmdDlyLong = '\x01';
    (this->_fileHdr).regCmdCnt = '\0';
  }
LAB_001116e0:
  ScanInitBlock(this);
  UVar4 = (this->_fileHdr).hwType;
  this->_realHwType = UVar4;
  if ((UVar4 == '\x01' && 1 < (this->_fileHdr).verMajor) &&
     ((UVar4 = (this->_playOpts).v2opl3Mode, UVar4 == '\x02' ||
      (((UVar4 == '\0' &&
        (rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->_initRegSet,0x105),
        (*rVar9._M_p & rVar9._M_mask) != 0)) && ((this->_initOPL3Enable & 1) != 0)))))) {
    this->_realHwType = '\x02';
  }
  puVar3 = (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  puVar3 = (this->_devPanning).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_devPanning).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (this->_devPanning).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  this_00 = &this->_devTypes;
  this_01 = &this->_devPanning;
  this->_portShift = '\0';
  if (this->_realHwType == '\x01') {
    local_28._0_6_ = CONCAT15(9,(undefined5)local_28);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (this_00,(uchar *)((long)&local_28 + 5));
    local_28._0_5_ = CONCAT14(1,(undefined4)local_28);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (this_01,(uchar *)((long)&local_28 + 4));
    local_28._0_4_ = CONCAT13(9,(undefined3)local_28);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (this_00,(uchar *)((long)&local_28 + 3));
    __args = (uchar *)((long)&local_28 + 2);
    local_28._0_3_ = CONCAT12(2,(undefined2)local_28);
  }
  else {
    if (this->_realHwType != '\0') {
      local_28._0_2_ = CONCAT11(0xc,(uchar)local_28);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (this_00,(uchar *)((long)&local_28 + 1));
      local_28 = local_28 & 0xffffffffffffff00;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (this_01,(uchar *)&local_28);
      this->_portShift = '\x01';
      goto LAB_00111811;
    }
    local_28 = CONCAT17(9,(uint7)local_28);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (this_00,(uchar *)((long)&local_28 + 7));
    __args = (uchar *)((long)&local_28 + 6);
    local_28._0_7_ = (uint7)(uint6)local_28;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (this_01,__args);
LAB_00111811:
  this->_portMask = ~(byte)(-1 << (this->_portShift & 0x1f));
  this->_totalTicks = (this->_fileHdr).lengthMS;
  GenerateDeviceConfig(this);
  return '\0';
}

Assistant:

UINT8 DROPlayer::LoadFile(DATA_LOADER *dataLoader)
{
	UINT32 tempLng;
	
	_dLoad = NULL;
	DataLoader_ReadUntil(dataLoader,0x10);
	_fileData = DataLoader_GetData(dataLoader);
	if (DataLoader_GetSize(dataLoader) < 0x10 || memcmp(&_fileData[0x00], "DBRAWOPL", 8))
		return 0xF0;	// invalid file
	
	// --- try to detect the DRO version ---
	tempLng = ReadLE32(&_fileData[0x08]);
	if (tempLng & 0xFF00FF00)
	{
		// DRO v0 - This version didn't write version bytes.
		_fileHdr.verMajor = 0x00;
		_fileHdr.verMinor = 0x00;
	}
	else if (! (tempLng & 0x0000FFFF))
	{
		// DRO v1 - order is: minor, major
		_fileHdr.verMinor = ReadLE16(&_fileData[0x08]);
		_fileHdr.verMajor = ReadLE16(&_fileData[0x0A]);
	}
	else
	{
		// DRO v2 - order is: major, minor
		_fileHdr.verMajor = ReadLE16(&_fileData[0x08]);
		_fileHdr.verMinor = ReadLE16(&_fileData[0x0A]);
	}
	if (_fileHdr.verMajor > 2)
		return 0xF1;	// unsupported version
	
	_dLoad = dataLoader;
	DataLoader_ReadAll(_dLoad);
	_fileData = DataLoader_GetData(_dLoad);
	
	switch(_fileHdr.verMajor)
	{
	case 0:	// version 0 (DOSBox 0.62)
	case 1:	// version 1 (DOSBox 0.63)
		switch(_fileHdr.verMajor)
		{
		case 0:
			_fileHdr.lengthMS = ReadLE32(&_fileData[0x08]);
			_fileHdr.dataSize = ReadLE32(&_fileData[0x0C]);
			_fileHdr.hwType = _fileData[0x10];
			_fileHdr.dataOfs = 0x11;
			break;
		case 1:
			_fileHdr.lengthMS = ReadLE32(&_fileData[0x0C]);
			_fileHdr.dataSize = ReadLE32(&_fileData[0x10]);
			tempLng = ReadLE32(&_fileData[0x14]);
			_fileHdr.hwType = (tempLng <= 0xFF) ? (UINT8)tempLng : 0xFF;
			_fileHdr.dataOfs = 0x18;
			break;
		}
		// swap DualOPL2 and OPL3 values
		if (_fileHdr.hwType == 0x01)
			_fileHdr.hwType = DROHW_OPL3;
		else if (_fileHdr.hwType == 0x02)
			_fileHdr.hwType = DROHW_DUALOPL2;
		_fileHdr.format = 0x00;
		_fileHdr.compression = 0x00;
		_fileHdr.cmdDlyShort = 0x00;
		_fileHdr.cmdDlyLong = 0x01;
		_fileHdr.regCmdCnt = 0x00;
		break;
	case 2:	// version 2 (DOSBox 0.73)
		_fileHdr.dataSize = ReadLE32(&_fileData[0x0C]) * 2;
		_fileHdr.lengthMS = ReadLE32(&_fileData[0x10]);
		_fileHdr.hwType = _fileData[0x14];
		_fileHdr.format = _fileData[0x15];
		_fileHdr.compression = _fileData[0x16];
		_fileHdr.cmdDlyShort = _fileData[0x17];
		_fileHdr.cmdDlyLong = _fileData[0x18];
		_fileHdr.regCmdCnt = _fileData[0x19];
		_fileHdr.dataOfs = 0x1A + _fileHdr.regCmdCnt;
		
		if (_fileHdr.regCmdCnt > 0x80)
			_fileHdr.regCmdCnt = 0x80;	// only 0x80 values are possible
		memcpy(_fileHdr.regCmdMap, &_fileData[0x1A], _fileHdr.regCmdCnt);
		
		break;
	}
	
	ScanInitBlock();
	
	_realHwType = _fileHdr.hwType;
	if (_fileHdr.verMajor >= 2)
	{
		// DOSBox puts "DualOPL2" into the header of DROs that log OPL3 data ...
		// ... unless the "4op enable" register is accessed while OPL3 mode is active.
		// This bug was introduced when DRO logging was rewritten for DOSBox 0.73.
		if (_realHwType == DROHW_DUALOPL2)
		{
			switch(_playOpts.v2opl3Mode)
			{
			case DRO_V2OPL3_DETECT:
				// if OPL3 enable is set, it definitely is an OPL3 file
				if (_initRegSet[0x105] && (_initOPL3Enable & 0x01))
					_realHwType = DROHW_OPL3;
				break;
			case DRO_V2OPL3_HEADER:
				// keep the value from the header
				break;
			case DRO_V2OPL3_ENFORCE:
				_realHwType = DROHW_OPL3;
				break;
			}
		}
	}
	
	_devTypes.clear();
	_devPanning.clear();
	_portShift = 0;
	switch(_realHwType)
	{
	case DROHW_OPL2:	// single OPL2
		_devTypes.push_back(DEVID_YM3812);	_devPanning.push_back(0x00);
		break;
	case DROHW_DUALOPL2:	// dual OPL2
		_devTypes.push_back(DEVID_YM3812);	_devPanning.push_back(0x01);
		_devTypes.push_back(DEVID_YM3812);	_devPanning.push_back(0x02);
		break;
	case DROHW_OPL3:	// single OPL3
	default:
		_devTypes.push_back(DEVID_YMF262);	_devPanning.push_back(0x00);
		_portShift = 1;
		break;
	}
	_portMask = (1 << _portShift) - 1;
	
	_totalTicks = _fileHdr.lengthMS;
	GenerateDeviceConfig();
	
	return 0x00;
}